

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ConstraintBlockSymbol::ConstraintBlockSymbol
          (ConstraintBlockSymbol *this,Compilation *c,string_view name,SourceLocation loc)

{
  (this->super_Symbol).kind = ConstraintBlock;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  Scope::Scope(&this->super_Scope,c,&this->super_Symbol);
  this->constraint = (Constraint *)0x0;
  this->outOfBlockIndex = 0;
  this->thisVar = (VariableSymbol *)0x0;
  this->isStatic = false;
  this->isExtern = false;
  this->isExplicitExtern = false;
  this->isPure = false;
  return;
}

Assistant:

ConstraintBlockSymbol::ConstraintBlockSymbol(Compilation& c, string_view name, SourceLocation loc) :
    Symbol(SymbolKind::ConstraintBlock, name, loc), Scope(c, this) {
}